

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

json_type __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::type
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_type jVar1;
  uint uVar2;
  json_runtime_error<std::domain_error,_void> *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  string_view_type sVar3;
  string_view_type sVar4;
  type tVar5;
  error_code eVar6;
  string sStack_50;
  json_type ajStack_30 [8];
  to_integer_result<long,_wchar_t> tStack_28;
  
  do {
    jVar1 = (json_type)
            (((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ &
            (array_value|byte_string_value);
    switch(jVar1) {
    case null_value:
    case bool_value:
    case int64_value:
    case uint64_value:
    case double_value:
      return jVar1;
    case half_value:
    case array_value|double_value:
      return object_value;
    case string_value:
      return half_value;
    case byte_string_value:
    case array_value|byte_string_value:
      return string_value;
    case array_value:
    case object_value:
    case array_value|int64_value:
    case array_value|uint64_value:
      while (uVar2 = (byte)((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                             *)&((pointer)this)->
                                super_heap_string_base<unsigned_long,_std::allocator<char>_>)->
                           json_const_pointer_ & 0xf, uVar2 - 8 < 2) {
        this = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               (((anon_union_16_15_54cbd7ed_for_basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                  *)&((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
               ->byte_str_).ptr_;
      }
      switch(uVar2) {
      case 1:
        ajStack_30[0] =
             *(json_type *)
              ((long)&(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>
                      ).extra_ + 2);
        break;
      case 2:
      case 3:
        ajStack_30[0] =
             (json_type)
             *(undefined8 *)
              &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
               field_0x8;
        break;
      default:
        this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
        sStack_50._M_dataplus._M_p = (pointer)&sStack_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_50,"Not an integer","");
        json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&sStack_50);
        __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
                    json_runtime_error<std::domain_error,_void>::~json_runtime_error);
      case 5:
        ajStack_30[0] =
             (json_type)
             (long)*(double *)
                    &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>)
                     .field_0x8;
        break;
      case 6:
        ajStack_30[0] =
             (json_type)
             *(undefined2 *)
              ((long)&(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>
                      ).extra_ + 2);
        break;
      case 7:
      case 0xf:
        sVar3 = as_string_view(this);
        sVar4 = as_string_view(this);
        tVar5 = detail::to_integer<long,wchar_t>(sVar3._M_str,sVar4._M_len,(long *)ajStack_30);
        tStack_28.ptr = tVar5.ptr;
        tStack_28.ec = tVar5.ec;
        if (tStack_28.ec != success) {
          this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
          eVar6 = detail::to_integer_result<long,_wchar_t>::error_code(&tStack_28);
          (**(code **)(*(long *)eVar6._M_cat + 0x20))(&sStack_50,eVar6._M_cat,eVar6._M_value);
          json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&sStack_50);
          __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                      json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
        }
      }
      return ajStack_30[0];
    case array_value|half_value:
      return byte_string_value;
    case array_value|string_value:
      return array_value;
    default:
      this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              &(((pointer)this)->super_heap_string_base<unsigned_long,_std::allocator<char>_>).
               field_0x8;
    }
  } while( true );
}

Assistant:

json_type type() const
        {
            switch(storage_kind())
            {
                case json_storage_kind::null:
                    return json_type::null_value;
                case json_storage_kind::boolean:
                    return json_type::bool_value;
                case json_storage_kind::int64:
                    return json_type::int64_value;
                case json_storage_kind::uint64:
                    return json_type::uint64_value;
                case json_storage_kind::half_float:
                    return json_type::half_value;
                case json_storage_kind::float64:
                    return json_type::double_value;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return json_type::string_value;
                case json_storage_kind::byte_str:
                    return json_type::byte_string_value;
                case json_storage_kind::array:
                    return json_type::array_value;
                case json_storage_kind::empty_object:
                case json_storage_kind::object:
                    return json_type::object_value;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().type();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().type();
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }